

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gena_device.c
# Opt level: O3

int genaNotifyAllCommon(UpnpDevice_Handle device_handle,char *UDN,char *servId,char *propertySet)

{
  LinkedList *list;
  void *input;
  Upnp_Handle_Type UVar1;
  uint uVar2;
  int *__ptr;
  char *__ptr_00;
  char *__ptr_01;
  service_info *service;
  undefined8 *__ptr_02;
  time_t tVar3;
  long lVar4;
  ListNode *pLVar5;
  ThreadPoolJob *job;
  subscription *psVar6;
  int line;
  Handle_Info **HndInfo;
  int DbgLineNo;
  Handle_Info *handle_info;
  subscription *local_58;
  char *local_50;
  Handle_Info *local_38;
  
  line = 2;
  UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_device.c",0x337,"GENA BEGIN NOTIFY ALL COMMON\n");
  __ptr = (int *)malloc(4);
  if (__ptr == (int *)0x0) {
    DbgLineNo = 0x33d;
    uVar2 = 0xffffff98;
    goto LAB_00116e01;
  }
  *__ptr = 0;
  __ptr_00 = strdup(UDN);
  if (__ptr_00 == (char *)0x0) {
    uVar2 = 0xffffff98;
    DbgLineNo = 0x345;
    local_50 = (char *)0x0;
    __ptr_01 = (char *)0x0;
  }
  else {
    local_50 = strdup(servId);
    uVar2 = 0xffffff98;
    if (local_50 == (char *)0x0) {
      DbgLineNo = 0x34c;
LAB_00116d5e:
      __ptr_01 = (char *)0x0;
    }
    else {
      __ptr_01 = AllocGenaHeaders(propertySet);
      if (__ptr_01 == (char *)0x0) {
        DbgLineNo = 0x353;
        goto LAB_00116d5e;
      }
      HandleLock((char *)0x358,line);
      HndInfo = &local_38;
      UVar1 = GetHandleInfo(device_handle,HndInfo);
      line = (int)HndInfo;
      if (UVar1 == HND_DEVICE) {
        service = FindServiceId(&local_38->ServiceTable,servId,UDN);
        line = (int)servId;
        if (service == (service_info *)0x0) {
          DbgLineNo = 0x3a3;
          uVar2 = 0xffffff91;
        }
        else {
          local_58 = GetFirstSubscription(service);
          line = (int)servId;
          if (local_58 == (subscription *)0x0) {
            uVar2 = 0;
            DbgLineNo = 0;
          }
          else {
            do {
              line = (int)servId;
              uVar2 = 0xffffff98;
              __ptr_02 = (undefined8 *)malloc(0x68);
              if (__ptr_02 == (undefined8 *)0x0) {
                DbgLineNo = 0x369;
                goto LAB_00116dd4;
              }
              *__ptr = *__ptr + 1;
              __ptr_02[0xb] = __ptr;
              __ptr_02[3] = __ptr_00;
              __ptr_02[2] = local_50;
              *__ptr_02 = __ptr_01;
              __ptr_02[1] = propertySet;
              strncpy((char *)(__ptr_02 + 4),local_58->sid,0x2c);
              *(undefined1 *)((long)__ptr_02 + 0x4b) = 0;
              tVar3 = time((time_t *)0x0);
              __ptr_02[10] = tVar3;
              *(UpnpDevice_Handle *)(__ptr_02 + 0xc) = device_handle;
              list = &local_58->outgoing;
              tVar3 = time((time_t *)0x0);
              lVar4 = ListSize(list);
              while (1 < lVar4) {
                pLVar5 = ListHead(list);
                if ((pLVar5 == (ListNode *)0x0) ||
                   (pLVar5 = pLVar5->next, pLVar5 == (ListNode *)0x0)) {
                  genaNotifyAllCommon_cold_1();
                  break;
                }
                input = *(void **)((long)pLVar5->item + 8);
                lVar4 = ListSize(list);
                if ((lVar4 <= g_UpnpSdkEQMaxLen) &&
                   (tVar3 - *(long *)((long)input + 0x50) <= (long)g_UpnpSdkEQMaxAge)) break;
                free_notify_struct(input);
                free(pLVar5->item);
                ListDelNode(list,pLVar5,0);
                lVar4 = ListSize(list);
              }
              line = 0x30;
              job = (ThreadPoolJob *)calloc(1,0x30);
              if (job == (ThreadPoolJob *)0x0) {
                free(__ptr_02);
                DbgLineNo = 0x380;
                uVar2 = 0xffffff98;
                goto LAB_00116dd4;
              }
              TPJobInit(job,genaNotifyThread,__ptr_02);
              TPJobSetFreeFunction(job,free_notify_struct);
              TPJobSetPriority(job,MED_PRIORITY);
              pLVar5 = ListAddTail(list,job);
              lVar4 = ListSize(list);
              if (lVar4 == 1) {
                uVar2 = ThreadPoolAdd(&gSendThreadPool,job,(int *)0x0);
                line = (int)job;
                if (uVar2 != 0) {
                  DbgLineNo = 0x396;
                  if (uVar2 == 0x20000000) {
                    uVar2 = 0xffffff98;
                  }
                  else {
                    DbgLineNo = 0x394;
                  }
                  goto LAB_00116dd4;
                }
                if (pLVar5 != (ListNode *)0x0) {
                  *(undefined4 *)((long)pLVar5->item + 0x2c) = 0x1fffffff;
                }
              }
              psVar6 = GetNextSubscription(service,local_58);
              line = (int)local_58;
              DbgLineNo = 0;
              servId = local_58->sid;
              local_58 = psVar6;
            } while (psVar6 != (subscription *)0x0);
            uVar2 = 0;
          }
        }
      }
      else {
        DbgLineNo = 0x35b;
        uVar2 = 0xffffff9c;
      }
    }
LAB_00116dd4:
    if (*__ptr != 0) goto LAB_00116e01;
  }
  free(__ptr_01);
  ixmlFreeDOMString(propertySet);
  free(local_50);
  free(__ptr_00);
  free(__ptr);
LAB_00116e01:
  HandleUnlock((char *)0x3b5,line);
  UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_device.c",DbgLineNo,
             "GENA END NOTIFY ALL COMMON, ret = %d\n",(ulong)uVar2);
  return uVar2;
}

Assistant:

static int genaNotifyAllCommon(UpnpDevice_Handle device_handle,
	char *UDN,
	char *servId,
	DOMString propertySet)
{
	int ret = GENA_SUCCESS;
	int line = 0;

	int *reference_count = NULL;
	char *UDN_copy = NULL;
	char *servId_copy = NULL;
	char *headers = NULL;
	notify_thread_struct *thread_s = NULL;

	subscription *finger = NULL;
	service_info *service = NULL;
	struct Handle_Info *handle_info;

	UpnpPrintf(UPNP_INFO,
		GENA,
		__FILE__,
		__LINE__,
		"GENA BEGIN NOTIFY ALL COMMON\n");

	/* Keep this allocation first */
	reference_count = (int *)malloc(sizeof(int));
	if (reference_count == NULL) {
		line = __LINE__;
		ret = UPNP_E_OUTOF_MEMORY;
		goto ExitFunction;
	}
	*reference_count = 0;

	UDN_copy = strdup(UDN);
	if (UDN_copy == NULL) {
		line = __LINE__;
		ret = UPNP_E_OUTOF_MEMORY;
		goto ExitFunction;
	}

	servId_copy = strdup(servId);
	if (servId_copy == NULL) {
		line = __LINE__;
		ret = UPNP_E_OUTOF_MEMORY;
		goto ExitFunction;
	}

	headers = AllocGenaHeaders(propertySet);
	if (headers == NULL) {
		line = __LINE__;
		ret = UPNP_E_OUTOF_MEMORY;
		goto ExitFunction;
	}

	HandleLock(__FILE__, __LINE__);

	if (GetHandleInfo(device_handle, &handle_info) != HND_DEVICE) {
		line = __LINE__;
		ret = GENA_E_BAD_HANDLE;
	} else {
		service =
			FindServiceId(&handle_info->ServiceTable, servId, UDN);
		if (service != NULL) {
			finger = GetFirstSubscription(service);
			while (finger) {
				ThreadPoolJob *job = NULL;
				ListNode *node;

				thread_s = (notify_thread_struct *)malloc(
					sizeof(notify_thread_struct));
				if (thread_s == NULL) {
					line = __LINE__;
					ret = UPNP_E_OUTOF_MEMORY;
					break;
				}

				(*reference_count)++;
				thread_s->reference_count = reference_count;
				thread_s->UDN = UDN_copy;
				thread_s->servId = servId_copy;
				thread_s->headers = headers;
				thread_s->propertySet = propertySet;
				strncpy(thread_s->sid,
					finger->sid,
					sizeof thread_s->sid);
				thread_s->sid[sizeof thread_s->sid - 1] = 0;
				thread_s->ctime = time(0);
				thread_s->device_handle = device_handle;

				maybeDiscardEvents(&finger->outgoing);
				job = (ThreadPoolJob *)malloc(
					sizeof(ThreadPoolJob));
				if (!job) {
					free(thread_s);
					line = __LINE__;
					ret = UPNP_E_OUTOF_MEMORY;
					break;
				}
				memset(job, 0, sizeof(ThreadPoolJob));
				TPJobInit(job,
					(start_routine)genaNotifyThread,
					thread_s);
				TPJobSetFreeFunction(
					job, (free_routine)free_notify_struct);
				TPJobSetPriority(job, MED_PRIORITY);
				node = ListAddTail(&finger->outgoing, job);

				/* If there is only one element on the list
				   (which we just
				   added), need to kickstart the threadpool */
				if (ListSize(&finger->outgoing) == 1) {
					ret = ThreadPoolAdd(
						&gSendThreadPool, job, NULL);
					if (ret != 0) {
						line = __LINE__;
						if (ret == EOUTOFMEM) {
							line = __LINE__;
							ret = UPNP_E_OUTOF_MEMORY;
						}
						break;
					}
					if (node) {
						((ThreadPoolJob *)(node->item))
							->jobId = STALE_JOBID;
					}
				}
				finger = GetNextSubscription(service, finger);
			}
		} else {
			line = __LINE__;
			ret = GENA_E_BAD_SERVICE;
		}
	}

ExitFunction:
	/* The only case where we want to free memory here is if the
	   struct was never queued. Else, let the normal cleanup take place.
	   reference_count is allocated first so it's ok to do nothing if it's 0
	*/
	if (reference_count && *reference_count == 0) {
		free(headers);
		ixmlFreeDOMString(propertySet);
		free(servId_copy);
		free(UDN_copy);
		free(reference_count);
	}

	HandleUnlock(__FILE__, __LINE__);

	UpnpPrintf(UPNP_INFO,
		GENA,
		__FILE__,
		line,
		"GENA END NOTIFY ALL COMMON, ret = %d\n",
		ret);

	return ret;
}